

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.h
# Opt level: O0

bool __thiscall
cppcms::cache_interface::fetch_data<mydata>
          (cache_interface *this,string *key,mydata *data,bool notriggers)

{
  byte bVar1;
  byte bVar2;
  byte in_CL;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  bool bVar3;
  string buffer;
  string local_48 [32];
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_CL & 1;
  std::__cxx11::string::string(local_48);
  bVar2 = cppcms::cache_interface::fetch(in_RDI,in_RSI,SUB81(local_48,0));
  bVar3 = (bVar2 & 1) != 0;
  if (bVar3) {
    serialization_traits<mydata,_void>::load
              (in_RDX,(serializable_base *)CONCAT17(bVar1,in_stack_ffffffffffffffd8));
  }
  std::__cxx11::string::~string(local_48);
  return bVar3;
}

Assistant:

bool fetch_data(std::string const &key,Serializable &data,bool notriggers=false)
		{
			std::string buffer;
			if(!fetch(key,buffer,notriggers))
				return false;
			serialization_traits<Serializable>::load(buffer,data);
			return true;
		}